

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

void __thiscall
spirv_cross::SPIRConstantOp::SPIRConstantOp
          (SPIRConstantOp *this,TypeID result_type,Op op,uint32_t *args,uint32_t length)

{
  size_t sVar1;
  ulong uVar2;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstantOp_003a4758;
  *(Op *)&(this->super_IVariant).field_0xc = op;
  (this->arguments).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->arguments).super_VectorView<unsigned_int>.ptr = (uint *)&(this->arguments).stack_storage;
  (this->arguments).buffer_capacity = 8;
  (this->basetype).id = result_type.id;
  SmallVector<unsigned_int,_8UL>::reserve(&this->arguments,(ulong)length);
  if (length != 0) {
    sVar1 = (this->arguments).super_VectorView<unsigned_int>.buffer_size;
    uVar2 = 0;
    do {
      SmallVector<unsigned_int,_8UL>::reserve(&this->arguments,sVar1 + 1);
      sVar1 = (this->arguments).super_VectorView<unsigned_int>.buffer_size;
      (this->arguments).super_VectorView<unsigned_int>.ptr[sVar1] = args[uVar2];
      sVar1 = sVar1 + 1;
      (this->arguments).super_VectorView<unsigned_int>.buffer_size = sVar1;
      uVar2 = uVar2 + 1;
    } while (length != uVar2);
  }
  return;
}

Assistant:

SPIRConstantOp(TypeID result_type, spv::Op op, const uint32_t *args, uint32_t length)
	    : opcode(op)
	    , basetype(result_type)
	{
		arguments.reserve(length);
		for (uint32_t i = 0; i < length; i++)
			arguments.push_back(args[i]);
	}